

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O1

void __thiscall irr::gui::CGUITabControl::clear(CGUITabControl *this)

{
  int *piVar1;
  IGUITab *pIVar2;
  long lVar3;
  pointer ppIVar4;
  pointer ppIVar5;
  ulong uVar6;
  
  ppIVar5 = (this->Tabs).m_data.
            super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->Tabs).m_data.
                          super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar5) >> 3) != 0) {
    uVar6 = 0;
    do {
      if (&ppIVar5[uVar6]->super_IGUIElement != (IGUIElement *)0x0) {
        IGUIElement::removeChild((IGUIElement *)this,&ppIVar5[uVar6]->super_IGUIElement);
        pIVar2 = (this->Tabs).m_data.
                 super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar6];
        lVar3 = *(long *)(*(long *)&(pIVar2->super_IGUIElement).super_IEventReceiver + -0x18);
        piVar1 = (int *)((long)&(pIVar2->super_IGUIElement).Children + lVar3 + 8U);
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          (**(code **)(*(long *)((long)&(pIVar2->super_IGUIElement).super_IEventReceiver + lVar3) +
                      8))();
        }
      }
      uVar6 = uVar6 + 1;
      ppIVar5 = (this->Tabs).m_data.
                super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < ((ulong)((long)(this->Tabs).m_data.
                                    super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar5) >> 3
                     & 0xffffffff));
  }
  ppIVar4 = (this->Tabs).m_data.
            super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  (this->Tabs).m_data.super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Tabs).m_data.super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Tabs).m_data.super__Vector_base<irr::gui::IGUITab_*,_std::allocator<irr::gui::IGUITab_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ppIVar5 != (pointer)0x0) {
    operator_delete(ppIVar5,(long)ppIVar4 - (long)ppIVar5);
  }
  (this->Tabs).is_sorted = true;
  recalculateScrollBar(this);
  return;
}

Assistant:

void CGUITabControl::clear()
{
	for (u32 i = 0; i < Tabs.size(); ++i) {
		if (Tabs[i]) {
			IGUIElement::removeChild(Tabs[i]);
			Tabs[i]->drop();
		}
	}
	Tabs.clear();

	recalculateScrollBar();
}